

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O2

optional<google::protobuf::io::Printer::AnnotationRecord> *
google::protobuf::io::anon_unknown_4::
LookupInFrameStack<google::protobuf::io::Printer::AnnotationRecord>
          (optional<google::protobuf::io::Printer::AnnotationRecord> *__return_storage_ptr__,
          string_view var,
          Span<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
          frames)

{
  reference this;
  size_type i;
  Span<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_38;
  
  i = frames.len_;
  local_38.ptr_ = frames.ptr_;
  local_38.len_ = i;
  while( true ) {
    i = i - 1;
    if (i == 0xffffffffffffffff) {
      (__return_storage_ptr__->
      super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>).
      _M_payload.
      super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged =
           false;
      return __return_storage_ptr__;
    }
    this = absl::lts_20250127::
           Span<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
           ::operator[](&local_38,i);
    std::
    function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>
    ::operator()(__return_storage_ptr__,this,var);
    if ((__return_storage_ptr__->
        super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>).
        _M_payload.
        super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
        .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged !=
        false) break;
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_reset
              ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
               __return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

absl::optional<T> LookupInFrameStack(
    absl::string_view var,
    absl::Span<std::function<absl::optional<T>(absl::string_view)>> frames) {
  for (size_t i = frames.size(); i >= 1; --i) {
    auto val = frames[i - 1](var);
    if (val.has_value()) {
      return val;
    }
  }
  return absl::nullopt;
}